

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bnll_x86.cpp
# Opt level: O2

int __thiscall ncnn::BNLL_x86::forward_inplace(BNLL_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  undefined1 (*pauVar5) [16];
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  
  iVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar10 = 0;
  uVar9 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar9 = uVar10;
  }
  for (; uVar10 != uVar9; uVar10 = uVar10 + 1) {
    pvVar1 = bottom_top_blob->data;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    pauVar5 = (undefined1 (*) [16])(sVar3 * uVar10 * sVar2 + (long)pvVar1);
    lVar8 = 0;
    for (iVar7 = 0; iVar7 + 3 < iVar6; iVar7 = iVar7 + 4) {
      auVar17 = minps(*pauVar5 | _DAT_004ec0f0,_DAT_004eef60);
      auVar17 = maxps(auVar17,_DAT_004eef70);
      fVar11 = auVar17._0_4_ * 1.442695 + 0.5;
      fVar14 = auVar17._4_4_ * 1.442695 + 0.5;
      fVar15 = auVar17._8_4_ * 1.442695 + 0.5;
      fVar16 = auVar17._12_4_ * 1.442695 + 0.5;
      fVar18 = (float)(int)fVar11;
      fVar19 = (float)(int)fVar14;
      fVar20 = (float)(int)fVar15;
      fVar21 = (float)(int)fVar16;
      fVar18 = fVar18 - (float)(-(uint)(fVar11 < fVar18) & 0x3f800000);
      fVar19 = fVar19 - (float)(-(uint)(fVar14 < fVar19) & 0x3f800000);
      fVar20 = fVar20 - (float)(-(uint)(fVar15 < fVar20) & 0x3f800000);
      fVar21 = fVar21 - (float)(-(uint)(fVar16 < fVar21) & 0x3f800000);
      fVar11 = auVar17._0_4_ - fVar18 * 0.6931472;
      fVar14 = auVar17._4_4_ - fVar19 * 0.6931472;
      fVar15 = auVar17._8_4_ - fVar20 * 0.6931472;
      fVar16 = auVar17._12_4_ - fVar21 * 0.6931472;
      auVar12._0_4_ =
           (float)((int)fVar18 * 0x800000 + 0x3f800000) *
           (fVar11 + 1.0 +
           (((((fVar11 * 0.00019875691 + 0.0013981999) * fVar11 + 0.008333452) * fVar11 +
             0.041665796) * fVar11 + 0.16666666) * fVar11 + 0.5) * fVar11 * fVar11) + 1.0;
      auVar12._4_4_ =
           (float)((int)fVar19 * 0x800000 + 0x3f800000) *
           (fVar14 + 1.0 +
           (((((fVar14 * 0.00019875691 + 0.0013981999) * fVar14 + 0.008333452) * fVar14 +
             0.041665796) * fVar14 + 0.16666666) * fVar14 + 0.5) * fVar14 * fVar14) + 1.0;
      auVar12._8_4_ =
           (float)((int)fVar20 * 0x800000 + 0x3f800000) *
           (fVar15 + 1.0 +
           (((((fVar15 * 0.00019875691 + 0.0013981999) * fVar15 + 0.008333452) * fVar15 +
             0.041665796) * fVar15 + 0.16666666) * fVar15 + 0.5) * fVar15 * fVar15) + 1.0;
      auVar12._12_4_ =
           (float)((int)fVar21 * 0x800000 + 0x3f800000) *
           (fVar16 + 1.0 +
           (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
             0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5) * fVar16 * fVar16) + 1.0;
      auVar13 = maxps(auVar12,_DAT_004ef010);
      fVar11 = (float)(auVar13._0_4_ & 0x807fffff | 0x3f000000);
      fVar15 = (float)(auVar13._4_4_ & 0x807fffff | 0x3f000000);
      fVar18 = (float)(auVar13._8_4_ & 0x807fffff | 0x3f000000);
      fVar20 = (float)(auVar13._12_4_ & 0x807fffff | 0x3f000000);
      fVar14 = fVar11 + -1.0 + (float)(-(uint)(fVar11 < 0.70710677) & (uint)fVar11);
      fVar16 = fVar15 + -1.0 + (float)(-(uint)(fVar15 < 0.70710677) & (uint)fVar15);
      fVar19 = fVar18 + -1.0 + (float)(-(uint)(fVar18 < 0.70710677) & (uint)fVar18);
      fVar21 = fVar20 + -1.0 + (float)(-(uint)(fVar20 < 0.70710677) & (uint)fVar20);
      auVar17._0_12_ = ZEXT812(0);
      auVar17._12_4_ = 0;
      auVar17 = maxps(*pauVar5,auVar17);
      *(float *)*pauVar5 =
           auVar17._0_4_ +
           (float)((uint)(((float)(int)((auVar13._0_4_ >> 0x17) - 0x7e) -
                          (float)(-(uint)(fVar11 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar14 +
                         (((((((((fVar14 * 0.070376836 + -0.1151461) * fVar14 + 0.116769984) *
                                fVar14 + -0.12420141) * fVar14 + 0.14249323) * fVar14 + -0.16668057)
                             * fVar14 + 0.20000714) * fVar14 + -0.24999994) * fVar14 + 0.3333333) *
                          fVar14 + -0.5) * fVar14 * fVar14) | -(uint)(auVar12._0_4_ <= 0.0));
      *(float *)(*pauVar5 + 4) =
           auVar17._4_4_ +
           (float)((uint)(((float)(int)((auVar13._4_4_ >> 0x17) - 0x7e) -
                          (float)(-(uint)(fVar15 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar16 +
                         (((((((((fVar16 * 0.070376836 + -0.1151461) * fVar16 + 0.116769984) *
                                fVar16 + -0.12420141) * fVar16 + 0.14249323) * fVar16 + -0.16668057)
                             * fVar16 + 0.20000714) * fVar16 + -0.24999994) * fVar16 + 0.3333333) *
                          fVar16 + -0.5) * fVar16 * fVar16) | -(uint)(auVar12._4_4_ <= 0.0));
      *(float *)(*pauVar5 + 8) =
           auVar17._8_4_ +
           (float)((uint)(((float)(int)((auVar13._8_4_ >> 0x17) - 0x7e) -
                          (float)(-(uint)(fVar18 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar19 +
                         (((((((((fVar19 * 0.070376836 + -0.1151461) * fVar19 + 0.116769984) *
                                fVar19 + -0.12420141) * fVar19 + 0.14249323) * fVar19 + -0.16668057)
                             * fVar19 + 0.20000714) * fVar19 + -0.24999994) * fVar19 + 0.3333333) *
                          fVar19 + -0.5) * fVar19 * fVar19) | -(uint)(auVar12._8_4_ <= 0.0));
      *(float *)(*pauVar5 + 0xc) =
           auVar17._12_4_ +
           (float)((uint)(((float)(int)((auVar13._12_4_ >> 0x17) - 0x7e) -
                          (float)(-(uint)(fVar20 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar21 +
                         (((((((((fVar21 * 0.070376836 + -0.1151461) * fVar21 + 0.116769984) *
                                fVar21 + -0.12420141) * fVar21 + 0.14249323) * fVar21 + -0.16668057)
                             * fVar21 + 0.20000714) * fVar21 + -0.24999994) * fVar21 + 0.3333333) *
                          fVar21 + -0.5) * fVar21 * fVar21) | -(uint)(auVar12._12_4_ <= 0.0));
      pauVar5 = pauVar5 + 1;
      lVar8 = lVar8 + 4;
    }
    lVar4 = sVar3 * sVar2 * uVar10;
    for (; (int)lVar8 < iVar6; lVar8 = lVar8 + 1) {
      fVar11 = *(float *)((long)pvVar1 + lVar8 * 4 + lVar4);
      if (fVar11 <= 0.0) {
        fVar11 = expf(fVar11);
        fVar14 = logf(fVar11 + 1.0);
      }
      else {
        fVar14 = expf(-fVar11);
        fVar14 = logf(fVar14 + 1.0);
        fVar14 = fVar14 + fVar11;
      }
      *(float *)((long)pvVar1 + lVar8 * 4 + lVar4) = fVar14;
    }
  }
  return 0;
}

Assistant:

int BNLL_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);
        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __mmask16 mask = _mm512_cmp_ps_mask(_p, _zero_avx512, _CMP_GT_OQ);
            __m512 _abs_p = _mm512_castsi512_ps(_mm512_and_epi32(_mm512_castps_si512(_p), _mm512_set1_epi32(0x7fffffff)));
            __m512 _tmp = log512_ps(_mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _abs_p))));
            _p = _mm512_mask_add_ps(_tmp, mask, _tmp, _p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 mask = _mm256_cmp_ps(_p, _mm256_setzero_ps(), _CMP_GT_OQ);
            __m256 _abs_p = _mm256_and_ps(_p, *(__m256*)_ps256_inv_sign_mask);
            __m256 _tmp = log256_ps(_mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _abs_p))));
            __m256 _x = _mm256_and_ps(_p, mask);
            _p = _mm256_add_ps(_x, _tmp);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 mask = _mm_cmpgt_ps(_p, _zero);
            __m128 _abs_p = _mm_and_ps(_p, *(__m128*)_ps_inv_sign_mask);
            __m128 _tmp = log_ps(_mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _abs_p))));
            __m128 _x = _mm_and_ps(_p, mask);
            _p = _mm_add_ps(_x, _tmp);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr > 0)
                *ptr = *ptr + logf(1.f + expf(-(*ptr)));
            else
                *ptr = logf(1.f + expf(*ptr));
            ptr++;
        }
    }
    return 0;
}